

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_open16(void *zFilename,sqlite3 **ppDb)

{
  sqlite3_value *v;
  char *zFilename_00;
  uint local_34;
  int rc;
  sqlite3_value *pVal;
  char *zFilename8;
  sqlite3 **ppDb_local;
  void *zFilename_local;
  
  *ppDb = (sqlite3 *)0x0;
  zFilename_local._4_4_ = sqlite3_initialize();
  if (zFilename_local._4_4_ == 0) {
    ppDb_local = (sqlite3 **)zFilename;
    if (zFilename == (void *)0x0) {
      ppDb_local = (sqlite3 **)anon_var_dwarf_1b039;
    }
    v = sqlite3ValueNew((sqlite3 *)0x0);
    sqlite3ValueSetStr(v,-1,ppDb_local,'\x02',(_func_void_void_ptr *)0x0);
    zFilename_00 = (char *)sqlite3ValueText(v,'\x01');
    if (zFilename_00 == (char *)0x0) {
      local_34 = 7;
    }
    else {
      local_34 = openDatabase(zFilename_00,ppDb,6,(char *)0x0);
      if ((local_34 == 0) && (((*ppDb)->aDb->pSchema->schemaFlags & 1) != 1)) {
        (*ppDb)->enc = '\x02';
        (*ppDb)->aDb->pSchema->enc = '\x02';
      }
    }
    sqlite3ValueFree(v);
    zFilename_local._4_4_ = local_34 & 0xff;
  }
  return zFilename_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_open16(
  const void *zFilename, 
  sqlite3 **ppDb
){
  char const *zFilename8;   /* zFilename encoded in UTF-8 instead of UTF-16 */
  sqlite3_value *pVal;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  if( zFilename==0 ) zFilename = "\000\000";
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zFilename, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zFilename8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zFilename8 ){
    rc = openDatabase(zFilename8, ppDb,
                      SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, 0);
    assert( *ppDb || rc==SQLITE_NOMEM );
    if( rc==SQLITE_OK && !DbHasProperty(*ppDb, 0, DB_SchemaLoaded) ){
      SCHEMA_ENC(*ppDb) = ENC(*ppDb) = SQLITE_UTF16NATIVE;
    }
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);

  return rc & 0xff;
}